

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O3

void __thiscall icu_63::RBBIRuleScanner::nextChar(RBBIRuleScanner *this,RBBIRuleChar *c)

{
  RBBIRuleBuilder *pRVar1;
  UErrorCode *pUVar2;
  UParseError *pUVar3;
  int32_t iVar4;
  int iVar5;
  UChar32 UVar6;
  int32_t i;
  int offset;
  bool bVar7;
  
  this->fScanIndex = this->fNextIndex;
  iVar5 = nextCharLL(this);
  c->fChar = iVar5;
  c->fEscaped = '\0';
  if (iVar5 == 0x27) {
    UVar6 = UnicodeString::char32At(this->fRB->fRules,this->fNextIndex);
    if (UVar6 != 0x27) {
      bVar7 = this->fQuoteMode == '\0';
      this->fQuoteMode = bVar7;
      c->fChar = bVar7 ^ 0x29;
      c->fEscaped = '\0';
      return;
    }
    iVar5 = nextCharLL(this);
    c->fChar = iVar5;
    c->fEscaped = '\x01';
  }
  if (this->fQuoteMode == '\0') {
    if (iVar5 == 0x23) {
      offset = this->fScanIndex;
      do {
        iVar5 = nextCharLL(this);
        c->fChar = iVar5;
        if (((iVar5 + 1U < 0xf) && ((0x4801U >> (iVar5 + 1U & 0x1f) & 1) != 0)) || (iVar5 == 0x2028)
           ) break;
      } while (iVar5 != 0x85);
      if (offset < this->fNextIndex + -1) {
        do {
          UnicodeString::setCharAt(&this->fRB->fStrippedRules,offset,L' ');
          offset = offset + 1;
        } while (offset < this->fNextIndex + -1);
        iVar5 = c->fChar;
      }
    }
    if (iVar5 == 0x5c) {
      c->fEscaped = '\x01';
      iVar5 = this->fNextIndex;
      UVar6 = UnicodeString::unescapeAt(this->fRB->fRules,&this->fNextIndex);
      c->fChar = UVar6;
      iVar5 = this->fNextIndex - iVar5;
      if (iVar5 == 0) {
        pRVar1 = this->fRB;
        pUVar2 = pRVar1->fStatus;
        if (*pUVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
          *pUVar2 = U_BRK_HEX_DIGITS_EXPECTED;
          pUVar3 = pRVar1->fParseError;
          if (pUVar3 != (UParseError *)0x0) {
            iVar4 = this->fCharNum;
            pUVar3->line = this->fLineNum;
            pUVar3->offset = iVar4;
            pUVar3->preContext[0] = L'\0';
            pUVar3->postContext[0] = L'\0';
          }
        }
      }
      this->fCharNum = this->fCharNum + iVar5;
    }
  }
  else {
    c->fEscaped = '\x01';
  }
  return;
}

Assistant:

void RBBIRuleScanner::nextChar(RBBIRuleChar &c) {

    // Unicode Character constants needed for the processing done by nextChar(),
    //   in hex because literals wont work on EBCDIC machines.

    fScanIndex = fNextIndex;
    c.fChar    = nextCharLL();
    c.fEscaped = FALSE;

    //
    //  check for '' sequence.
    //  These are recognized in all contexts, whether in quoted text or not.
    //
    if (c.fChar == chApos) {
        if (fRB->fRules.char32At(fNextIndex) == chApos) {
            c.fChar    = nextCharLL();        // get nextChar officially so character counts
            c.fEscaped = TRUE;                //   stay correct.
        }
        else
        {
            // Single quote, by itself.
            //   Toggle quoting mode.
            //   Return either '('  or ')', because quotes cause a grouping of the quoted text.
            fQuoteMode = !fQuoteMode;
            if (fQuoteMode == TRUE) {
                c.fChar = chLParen;
            } else {
                c.fChar = chRParen;
            }
            c.fEscaped = FALSE;      // The paren that we return is not escaped.
            return;
        }
    }

    if (fQuoteMode) {
        c.fEscaped = TRUE;
    }
    else
    {
        // We are not in a 'quoted region' of the source.
        //
        if (c.fChar == chPound) {
            // Start of a comment.  Consume the rest of it.
            //  The new-line char that terminates the comment is always returned.
            //  It will be treated as white-space, and serves to break up anything
            //    that might otherwise incorrectly clump together with a comment in
            //    the middle (a variable name, for example.)
            int32_t commentStart = fScanIndex;
            for (;;) {
                c.fChar = nextCharLL();
                if (c.fChar == (UChar32)-1 ||  // EOF
                    c.fChar == chCR     ||
                    c.fChar == chLF     ||
                    c.fChar == chNEL    ||
                    c.fChar == chLS)       {break;}
            }
            for (int32_t i=commentStart; i<fNextIndex-1; ++i) {
                fRB->fStrippedRules.setCharAt(i, u' ');
            }
        }
        if (c.fChar == (UChar32)-1) {
            return;
        }

        //
        //  check for backslash escaped characters.
        //  Use UnicodeString::unescapeAt() to handle them.
        //
        if (c.fChar == chBackSlash) {
            c.fEscaped = TRUE;
            int32_t startX = fNextIndex;
            c.fChar = fRB->fRules.unescapeAt(fNextIndex);
            if (fNextIndex == startX) {
                error(U_BRK_HEX_DIGITS_EXPECTED);
            }
            fCharNum += fNextIndex-startX;
        }
    }
    // putc(c.fChar, stdout);
}